

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall CDesign::GetNumNet(CDesign *this,int iMode,int iValue)

{
  uint uVar1;
  CNet *pCVar2;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int iNum;
  int iValue_local;
  int iMode_local;
  CDesign *this_local;
  
  if ((iValue == 3) || (iValue == 5)) {
    this_local._4_4_ = this->m_iNumNet;
  }
  else {
    i_1 = 0;
    if (iMode == 0) {
      for (local_28 = 0; local_28 < this->m_iNumNet; local_28 = local_28 + 1) {
        pCVar2 = GetNet(this,local_28);
        uVar1 = CObject::GetProp(&pCVar2->super_CObject);
        if ((uVar1 & iValue) != 0) {
          i_1 = i_1 + 1;
        }
      }
    }
    else {
      if (iMode != 1) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x489,"int CDesign::GetNumNet(int, int)");
      }
      for (local_2c = 0; local_2c < this->m_iNumNet; local_2c = local_2c + 1) {
        pCVar2 = GetNet(this,local_2c);
        uVar1 = CObject::GetState(&pCVar2->super_CObject);
        if ((uVar1 & iValue) != 0) {
          i_1 = i_1 + 1;
        }
      }
    }
    this_local._4_4_ = i_1;
  }
  return this_local._4_4_;
}

Assistant:

int CDesign::GetNumNet(int iMode, int iValue)
{
	if(iValue==STATE_NET_ANY||iValue==PROP_NET_ANY)	return	m_iNumNet;

	int	iNum	=	0;
	switch(iMode) {
	case GET_MODE_PROP:	//count the nets which has iValue as the property
		for(int i=0;i<m_iNumNet;++i)	if(GetNet(i)->GetProp()&iValue)	++iNum;
		break;
	case GET_MODE_STATE://count the nets which has iValue as the state
		for(int i=0;i<m_iNumNet;++i)	if(GetNet(i)->GetState()&iValue)	++iNum;
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iNum;
}